

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall Commands::MatchFailure::emit(MatchFailure *this,ProgramContext *program)

{
  undefined8 this_00;
  bool bVar1;
  element_type *context;
  char *pcVar2;
  undefined1 local_38 [8];
  string message;
  ProgramContext *program_local;
  MatchFailure *this_local;
  
  message.field_2._8_8_ = program;
  to_string_abi_cxx11_((string *)local_38,this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  this_00 = message.field_2._8_8_;
  if (bVar1) {
    context = std::__shared_ptr_access<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ProgramContext::error<SyntaxTree>((ProgramContext *)this_00,context,pcVar2);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ProgramContext::error<tag_nocontext_t>
              ((ProgramContext *)this_00,(tag_nocontext_t *)&nocontext,pcVar2);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Commands::MatchFailure::emit(ProgramContext& program)
{
    auto message = this->to_string();
    if(this->context)
        program.error(*this->context, message.c_str());
    else
        program.error(nocontext, message.c_str());
}